

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O3

int __thiscall UnifiedRegex::OctoquadIdentifier::GetOrAddCharCode(OctoquadIdentifier *this,Char c)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -1;
  if ((ushort)(c + L'﾿') < 0x1a) {
    uVar1 = this->numCodes;
    if (0 < (long)(int)uVar1) {
      uVar3 = 0;
      do {
        if ((*this->codeToChar)[uVar3] == c) {
          return (int)uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      if (uVar1 == 4) {
        return -1;
      }
    }
    (*this->codeToChar)[(int)uVar1] = (char)c;
    (*this->charToCode)[(ushort)c] = (char)this->numCodes;
    iVar2 = this->numCodes;
    this->numCodes = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int OctoquadIdentifier::GetOrAddCharCode(const Char c)
    {
        if (c >= static_cast<Char>('A') && c <= static_cast<Char>('Z'))
        {
            for (int i = 0; i < numCodes; i++)
            {
                if (codeToChar[i] == static_cast<char>(c))
                    return i;
            }
            if (numCodes == TrigramAlphabet::AlphaCount)
                return -1;
            codeToChar[numCodes] = static_cast<char>(c);
            charToCode[c] = static_cast<char>(numCodes);
            return numCodes++;
        }
        else
            return -1;
    }